

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

int __thiscall Server::open(Server *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  mapped_type *pmVar2;
  SourceFile file;
  ServerFile entry;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,*___oflag,___oflag[1] + *___oflag);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_f0,local_e8 + (long)local_f0);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,local_d0,local_c8 + (long)local_d0);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,*___oflag,___oflag[1] + *___oflag);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile>_>_>
           ::operator[](&fileMap_abi_cxx11_,(key_type *)__file);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::_M_assign((string *)&(pmVar2->file).content);
  std::__cxx11::string::_M_assign((string *)&pmVar2->text);
  iVar1 = std::__cxx11::string::_M_assign((string *)&pmVar2->uri);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar1 = extraout_EAX;
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
    iVar1 = extraout_EAX_00;
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
    iVar1 = extraout_EAX_01;
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
    iVar1 = extraout_EAX_02;
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
    iVar1 = extraout_EAX_03;
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
    iVar1 = extraout_EAX_04;
  }
  return iVar1;
}

Assistant:

void Server::open(std::string uri, std::string text)
{
    auto file = soul::SourceFile{uri, text};
    auto entry = ServerFile{
        file,
        text,
        uri};
    fileMap[uri] = entry;
}